

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void FFT::Backward(UnityComplexNumber *data,int numsamples,bool highprecision)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  UnityComplexNumber UVar3;
  
  if ((int)CONCAT71(in_register_00000011,highprecision) == 0) {
    FFTProcess<float>(data,numsamples,false);
  }
  else {
    FFTProcess<double>(data,numsamples,false);
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)numsamples;
  if (numsamples < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    UVar3.re = data[uVar1].re * (1.0 / (float)numsamples);
    UVar3.im = data[uVar1].im * (1.0 / (float)numsamples);
    data[uVar1] = UVar3;
  }
  return;
}

Assistant:

void FFT::Backward(UnityComplexNumber* data, int numsamples, bool highprecision)
{
    if (highprecision)
        FFTProcess<double>(data, numsamples, false);
    else
        FFTProcess<float>(data, numsamples, false);

    const float scale = 1.0f / (float)numsamples;
    for (int n = 0; n < numsamples; n++)
    {
        data[n].re *= scale;
        data[n].im *= scale;
    }
}